

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O3

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::process
          (actual_elapsed_timers_collector_t *this)

{
  demands_container_t *this_00;
  _Elt_pointer pdVar1;
  abstract_message_box_t *paVar2;
  _Map_pointer ppdVar3;
  _Map_pointer ppdVar4;
  size_t sVar5;
  _Elt_pointer pdVar6;
  _Elt_pointer pdVar7;
  _Elt_pointer pdVar8;
  _Elt_pointer pdVar9;
  _Map_pointer ppdVar10;
  demand_t *d;
  _Elt_pointer pdVar11;
  _Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  local_78;
  
  pdVar8 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pdVar9 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppdVar10 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node;
  pdVar1 = (this->m_demands).
           super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pdVar11 = pdVar8;
  if (pdVar8 != pdVar1) {
    do {
      paVar2 = (pdVar8->m_mbox).m_obj;
      (*paVar2->_vptr_abstract_message_box_t[0xb])(paVar2,pdVar8,&pdVar8->m_message);
      pdVar8 = pdVar8 + 1;
      if (pdVar8 == pdVar9) {
        pdVar8 = ppdVar10[1];
        ppdVar10 = ppdVar10 + 1;
        pdVar9 = pdVar8 + 0x15;
      }
    } while (pdVar8 != pdVar1);
    ppdVar10 = (this->m_demands).
               super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pdVar8 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pdVar9 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    pdVar11 = (this->m_demands).
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur;
  }
  ppdVar3 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  this_00 = &this->m_demands;
  if (999 < ((long)pdVar9 - (long)pdVar11 >> 3) * -0x5555555555555555 +
            (((long)ppdVar3 - (long)ppdVar10 >> 3) + -1 + (ulong)(ppdVar3 == (_Map_pointer)0x0)) *
            0x15 + ((long)pdVar8 -
                    (long)(this->m_demands).
                          super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) *
                   -0x5555555555555555) {
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    std::
    _Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::_M_initialize_map(&local_78,0);
    ppdVar4 = (this_00->
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              )._M_impl.super__Deque_impl_data._M_map;
    sVar5 = (this->m_demands).
            super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
            ._M_impl.super__Deque_impl_data._M_map_size;
    pdVar9 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pdVar1 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
    pdVar8 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppdVar10 = (this->m_demands).
               super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node;
    pdVar11 = (this->m_demands).
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    pdVar6 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pdVar7 = (this->m_demands).
             super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_last;
    ppdVar3 = (this->m_demands).
              super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    (this_00->
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    )._M_impl.super__Deque_impl_data._M_map = local_78._M_impl.super__Deque_impl_data._M_map;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_map_size =
         local_78._M_impl.super__Deque_impl_data._M_map_size;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_start._M_cur =
         local_78._M_impl.super__Deque_impl_data._M_start._M_cur;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_start._M_first =
         local_78._M_impl.super__Deque_impl_data._M_start._M_first;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_start._M_last =
         local_78._M_impl.super__Deque_impl_data._M_start._M_last;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_start._M_node =
         local_78._M_impl.super__Deque_impl_data._M_start._M_node;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_78._M_impl.super__Deque_impl_data._M_finish._M_cur;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_first =
         local_78._M_impl.super__Deque_impl_data._M_finish._M_first;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_last =
         local_78._M_impl.super__Deque_impl_data._M_finish._M_last;
    (this->m_demands).
    super__Deque_base<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_node =
         local_78._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_78._M_impl.super__Deque_impl_data._M_map = ppdVar4;
    local_78._M_impl.super__Deque_impl_data._M_map_size = sVar5;
    local_78._M_impl.super__Deque_impl_data._M_start._M_cur = pdVar9;
    local_78._M_impl.super__Deque_impl_data._M_start._M_first = pdVar1;
    local_78._M_impl.super__Deque_impl_data._M_start._M_last = pdVar8;
    local_78._M_impl.super__Deque_impl_data._M_start._M_node = ppdVar10;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar11;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_first = pdVar6;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_last = pdVar7;
    local_78._M_impl.super__Deque_impl_data._M_finish._M_node = ppdVar3;
    std::
    deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
    ::~deque((deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
              *)&local_78);
    return;
  }
  std::
  deque<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t,_std::allocator<so_5::env_infrastructures::st_reusable_stuff::actual_elapsed_timers_collector_t::demand_t>_>
  ::clear(this_00);
  return;
}

Assistant:

void
		process()
			{
				for( auto & d : m_demands )
				{
					so_5::rt::impl::mbox_iface_for_timers_t{ d.m_mbox }
							.deliver_message_from_timer( d.m_type_index, d.m_message );
				}

				// A defense from cases where were too many timers.
				if( m_demands.size() < 1000 )
					// A simple clean is enough.
					m_demands.clear();
				else
					{
						// Old container must be utilized.
						demands_container_t demands;
						demands.swap( m_demands );
					}
			}